

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Generators::
Generators<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>::
populate(Generators<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>
         *this,binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> *val
        )

{
  IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>
  *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_false>
  local_18;
  
  local_18._M_head_impl = in_RAX;
  value<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>
            ((Generators *)&local_18,val);
  std::
  vector<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>,std::allocator<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>>>
  ::
  emplace_back<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>>
            ((vector<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>,std::allocator<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>>>
              *)&this->m_generators,
             (GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>
              *)&local_18);
  if (local_18._M_head_impl !=
      (IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>
       *)0x0) {
    (*((local_18._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }